

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_ack_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  anon_struct_752_18_c516dbe2_for_egress *loss;
  uint64_t *puVar2;
  uint32_t uVar3;
  ulong uVar4;
  st_quicly_application_space_t *psVar5;
  long stream_id;
  size_t sVar6;
  int64_t iVar7;
  _func_void_void_ptr_char_ptr_varargs *p_Var8;
  undefined1 auVar9 [16];
  bool bVar10;
  quicly_sent_t *pqVar11;
  int iVar12;
  uint uVar13;
  uint64_t uVar14;
  uint64_t uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  quicly_sentmap_iter_t iter;
  quicly_ack_frame_t frame;
  int local_10b4;
  int64_t local_1098;
  long local_1090;
  quicly_sentmap_iter_t local_1070;
  quicly_ack_frame_t local_1058;
  
  iVar12 = quicly_decode_ack_frame
                     (&state->src,state->end,&local_1058,(uint)(state->frame_type == 3));
  if (iVar12 == 0) {
    if (state->epoch == 1) {
      iVar12 = 0x2000a;
    }
    else {
      if (state->epoch == 2) {
        paVar1 = &(conn->super).remote.address_validation;
        *(byte *)paVar1 = *(byte *)paVar1 & 0xfd;
      }
      loss = &conn->egress;
      quicly_loss_init_sentmap_iter
                (&loss->loss,&local_1070,(conn->stash).now,
                 (uint)(conn->super).remote.transport_params.max_ack_delay,
                 (uint)(QUICLY_STATE_CONNECTED < (conn->super).state));
      local_1098 = 0x7fffffffffffffff;
      uVar21 = 0xffffffffffffffff;
      bVar10 = false;
      local_1090 = 0;
      uVar14 = local_1058.num_gaps;
      uVar23 = local_1058.smallest_acknowledged;
      do {
        uVar15 = local_1058.ack_block_lengths[uVar14];
        if (uVar15 == 0) {
          __assert_fail("frame.ack_block_lengths[gap_index] != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                        ,0x129d,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
        if ((local_1070.p)->acked != quicly_sentmap__type_packet) {
LAB_00132c57:
          __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                        ,0x13c,
                        "const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)");
        }
        uVar17 = (uVar15 + uVar23) - 1;
        uVar16 = uVar15 + uVar23;
        while (((local_1070.p)->data).packet.packet_number < uVar23) {
          quicly_sentmap_skip(&local_1070);
          if ((local_1070.p)->acked != quicly_sentmap__type_packet) goto LAB_00132c57;
        }
        do {
          pqVar11 = local_1070.p;
          if ((local_1070.p)->acked != quicly_sentmap__type_packet) goto LAB_00132c57;
          uVar4 = ((local_1070.p)->data).packet.packet_number;
          if (uVar4 < uVar23) {
            __assert_fail("pn_acked <= pn_sent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                          ,0x12a7,
                          "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                         );
          }
          uVar22 = uVar23;
          if ((uVar4 <= uVar23) ||
             (iVar18 = 7, uVar22 = uVar4, uVar23 = uVar16, iVar12 = local_10b4, uVar4 <= uVar17)) {
            iVar18 = 1;
            uVar23 = uVar22;
            if (state->epoch == (ulong)((local_1070.p)->data).packet.ack_epoch) {
              if ((*(byte *)((long)&(local_1070.p)->data + 0x11) & 1) == 0) {
                uVar20 = 0;
              }
              else {
                bVar10 = true;
                if (((local_1070.p)->data).packet.cc_bytes_in_flight == 0) {
                  puVar2 = &(conn->super).stats.num_packets.late_acked;
                  *puVar2 = *puVar2 + 1;
                  uVar20 = 1;
                }
                else {
                  uVar20 = 0;
                }
              }
              puVar2 = &(conn->super).stats.num_packets.ack_received;
              *puVar2 = *puVar2 + 1;
              local_1098 = ((local_1070.p)->data).packet.sent_at;
              p_Var8 = (conn->super).tracer.cb;
              if (p_Var8 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
                (*p_Var8)((conn->super).tracer.ctx,
                          "{\"type\":\"packet-acked\", \"time\":%lld, \"pn\":%llu, \"is-late-ack\":%lld}\n"
                          ,(conn->stash).now,uVar22,uVar20);
              }
              local_1090 = local_1090 + (ulong)(pqVar11->data).packet.cc_bytes_in_flight;
              iVar12 = quicly_sentmap_update
                                 (&(conn->egress).loss.sentmap,&local_1070,
                                  QUICLY_SENTMAP_EVENT_ACKED);
              uVar21 = uVar22;
              if (iVar12 == 0) {
                if ((state->epoch == 3) &&
                   (psVar5 = conn->application, (psVar5->cipher).egress.key_update_pn.last <= uVar22
                   )) {
                  (psVar5->cipher).egress.key_update_pn.last = 0xffffffffffffffff;
                  (psVar5->cipher).egress.key_update_pn.next =
                       ((conn->super).ctx)->max_packets_per_key + (conn->egress).packet_number;
                }
                iVar18 = 0;
                uVar23 = uVar22 + 1;
                iVar12 = local_10b4;
              }
            }
            else {
              local_10b4 = 0x2000a;
              iVar12 = local_10b4;
            }
          }
          local_10b4 = iVar12;
          if (iVar18 != 0) {
            uVar15 = uVar14;
            if (iVar18 != 7) goto LAB_0013299a;
            break;
          }
        } while (uVar23 <= uVar17);
        if (uVar23 != uVar16) {
          __assert_fail("pn_acked == pn_block_max + 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                        ,0x12cf,
                        "int handle_ack_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                       );
        }
        iVar18 = 4;
        uVar15 = uVar14 - 1;
        if (uVar14 != 0) {
          uVar23 = uVar23 + local_1058.gaps[uVar14 - 1];
          iVar18 = 0;
        }
LAB_0013299a:
        uVar14 = uVar15;
      } while (iVar18 == 0);
      iVar12 = local_10b4;
      if (iVar18 == 4) {
        stream_id = (conn->stash).on_ack_stream.active_acked_cache.stream_id;
        iVar12 = 0;
        if (stream_id != -0x8000000000000000) {
          iVar12 = on_ack_stream_ack_one
                             (conn,stream_id,&(conn->stash).on_ack_stream.active_acked_cache.args);
          (conn->stash).on_ack_stream.active_acked_cache.stream_id = -0x8000000000000000;
        }
        if (iVar12 == 0) {
          if (uVar21 != 0xffffffffffffffff) {
            sVar6 = state->epoch;
            if ('\0' < (conn->egress).loss.pto_count) {
              (conn->egress).loss.pto_count = '\0';
            }
            if ((conn->egress).loss.largest_acked_packet_plus1[sVar6] <= uVar21) {
              iVar7 = (conn->stash).now;
              (conn->egress).loss.largest_acked_packet_plus1[sVar6] = uVar21 + 1;
              if (bVar10) {
                auVar9._8_8_ = 0;
                auVar9._0_8_ = (local_1058.ack_delay <<
                               (*(conn->egress).loss.ack_delay_exponent & 0x3f)) * 2 + 1000 >> 4;
                uVar19 = SUB164(auVar9 * ZEXT816(0x20c49ba5e353f7d),8);
                uVar13 = (uint)*(conn->egress).loss.max_ack_delay;
                if (uVar19 < uVar13) {
                  uVar13 = uVar19;
                }
                local_1098._0_4_ = (int)iVar7 - (int)local_1098;
                if ((int)local_1098 == -1) {
                  __assert_fail("latest_rtt != UINT32_MAX",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                                ,0xc6,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
                }
                uVar19 = (int)local_1098 + (uint)((int)local_1098 == 0);
                uVar3 = (conn->egress).loss.rtt.latest;
                (conn->egress).loss.rtt.latest = uVar19;
                if (uVar19 < (conn->egress).loss.rtt.minimum) {
                  (conn->egress).loss.rtt.minimum = uVar19;
                }
                if ((conn->egress).loss.rtt.minimum + uVar13 < uVar19) {
                  (conn->egress).loss.rtt.latest = uVar19 - uVar13;
                }
                if (uVar3 == 0) {
                  uVar13 = (conn->egress).loss.rtt.latest;
                  (conn->egress).loss.rtt.smoothed = uVar13;
                  (conn->egress).loss.rtt.variance = uVar13 >> 1;
                }
                else {
                  uVar13 = (conn->egress).loss.rtt.latest;
                  uVar19 = (conn->egress).loss.rtt.smoothed;
                  iVar12 = uVar19 - uVar13;
                  if (uVar19 < uVar13) {
                    iVar12 = -(uVar19 - uVar13);
                  }
                  (conn->egress).loss.rtt.variance =
                       (conn->egress).loss.rtt.variance * 3 + iVar12 >> 2;
                  (conn->egress).loss.rtt.smoothed = uVar19 * 7 + uVar13 >> 3;
                }
                if ((conn->egress).loss.rtt.smoothed == 0) {
                  __assert_fail("rtt->smoothed != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                                ,0xda,"void quicly_rtt_update(quicly_rtt_t *, uint32_t, uint32_t)");
                }
              }
            }
          }
          if (local_1090 != 0) {
            (*((conn->egress).cc.type)->cc_on_acked)
                      (&(conn->egress).cc,&loss->loss,(uint32_t)local_1090,
                       local_1058.largest_acknowledged,
                       (int)(conn->egress).loss.sentmap.bytes_in_flight + (uint32_t)local_1090,
                       (conn->stash).now,(uint)(conn->egress).max_udp_payload_size);
            p_Var8 = (conn->super).tracer.cb;
            if (p_Var8 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
              (*p_Var8)((conn->super).tracer.ctx,
                        "{\"type\":\"quictrace-cc-ack\", \"time\":%lld, \"min-rtt\":%u, \"smoothed-rtt\":%u, \"latest-rtt\":%u, \"cwnd\":%llu, \"inflight\":%llu}\n"
                        ,(conn->stash).now,(ulong)(conn->egress).loss.rtt.minimum,
                        (ulong)(conn->egress).loss.rtt.smoothed,
                        (ulong)(conn->egress).loss.rtt.latest,(ulong)(conn->egress).cc.cwnd,
                        (conn->egress).loss.sentmap.bytes_in_flight);
            }
          }
          p_Var8 = (conn->super).tracer.cb;
          if (p_Var8 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
            (*p_Var8)((conn->super).tracer.ctx,
                      "{\"type\":\"cc-ack-received\", \"time\":%lld, \"largest-acked\":%llu, \"bytes-acked\":%llu, \"cwnd\":%llu, \"inflight\":%llu}\n"
                      ,(conn->stash).now,local_1058.largest_acknowledged,local_1090,
                      (ulong)(conn->egress).cc.cwnd,(conn->egress).loss.sentmap.bytes_in_flight);
          }
          uVar13 = 0;
          if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
            uVar13 = (uint)(conn->handshake == (st_quicly_handshake_space_t *)0x0);
          }
          iVar12 = quicly_loss_detect_loss
                             (&loss->loss,(conn->stash).now,
                              (uint)(conn->super).remote.transport_params.max_ack_delay,uVar13,
                              on_loss_detected);
          if (iVar12 == 0) {
            update_loss_alarm(conn,0);
            iVar12 = 0;
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static int handle_ack_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_ack_frame_t frame;
    quicly_sentmap_iter_t iter;
    struct {
        uint64_t pn;
        int64_t sent_at;
    } largest_newly_acked = {UINT64_MAX, INT64_MAX};
    size_t bytes_acked = 0;
    int includes_ack_eliciting = 0, ret;

    if ((ret = quicly_decode_ack_frame(&state->src, state->end, &frame, state->frame_type == QUICLY_FRAME_TYPE_ACK_ECN)) != 0)
        return ret;

    uint64_t pn_acked = frame.smallest_acknowledged;

    switch (state->epoch) {
    case QUICLY_EPOCH_0RTT:
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
    case QUICLY_EPOCH_HANDSHAKE:
        conn->super.remote.address_validation.send_probe = 0;
        break;
    default:
        break;
    }

    init_acks_iter(conn, &iter);

    /* TODO log PNs being ACKed too late */

    size_t gap_index = frame.num_gaps;
    while (1) {
        assert(frame.ack_block_lengths[gap_index] != 0);
        /* Ack blocks are organized in the ACK frame and consequently in the ack_block_lengths array from the largest acked down.
         * Processing acks in packet number order requires processing the ack blocks in reverse order. */
        uint64_t pn_block_max = pn_acked + frame.ack_block_lengths[gap_index] - 1;
        QUICLY_PROBE(ACK_BLOCK_RECEIVED, conn, conn->stash.now, pn_acked, pn_block_max);
        while (quicly_sentmap_get(&iter)->packet_number < pn_acked)
            quicly_sentmap_skip(&iter);
        do {
            const quicly_sent_packet_t *sent = quicly_sentmap_get(&iter);
            uint64_t pn_sent = sent->packet_number;
            assert(pn_acked <= pn_sent);
            if (pn_acked < pn_sent) {
                /* set pn_acked to pn_sent; or past the end of the ack block, for use with the next ack block */
                if (pn_sent <= pn_block_max) {
                    pn_acked = pn_sent;
                } else {
                    pn_acked = pn_block_max + 1;
                    break;
                }
            }
            /* process newly acked packet */
            if (state->epoch != sent->ack_epoch)
                return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
            int is_late_ack = 0;
            if (sent->ack_eliciting) {
                includes_ack_eliciting = 1;
                if (sent->cc_bytes_in_flight == 0) {
                    is_late_ack = 1;
                    ++conn->super.stats.num_packets.late_acked;
                }
            }
            ++conn->super.stats.num_packets.ack_received;
            largest_newly_acked.pn = pn_acked;
            largest_newly_acked.sent_at = sent->sent_at;
            QUICLY_PROBE(PACKET_ACKED, conn, conn->stash.now, pn_acked, is_late_ack);
            if (sent->cc_bytes_in_flight != 0) {
                bytes_acked += sent->cc_bytes_in_flight;
            }
            if ((ret = quicly_sentmap_update(&conn->egress.loss.sentmap, &iter, QUICLY_SENTMAP_EVENT_ACKED)) != 0)
                return ret;
            if (state->epoch == QUICLY_EPOCH_1RTT) {
                struct st_quicly_application_space_t *space = conn->application;
                if (space->cipher.egress.key_update_pn.last <= pn_acked) {
                    space->cipher.egress.key_update_pn.last = UINT64_MAX;
                    space->cipher.egress.key_update_pn.next = conn->egress.packet_number + conn->super.ctx->max_packets_per_key;
                    QUICLY_PROBE(CRYPTO_SEND_KEY_UPDATE_CONFIRMED, conn, conn->stash.now, space->cipher.egress.key_update_pn.next);
                }
            }
            ++pn_acked;
        } while (pn_acked <= pn_block_max);
        assert(pn_acked == pn_block_max + 1);
        if (gap_index-- == 0)
            break;
        pn_acked += frame.gaps[gap_index];
    }

    if ((ret = on_ack_stream_ack_cached(conn)) != 0)
        return ret;

    QUICLY_PROBE(ACK_DELAY_RECEIVED, conn, conn->stash.now, frame.ack_delay);

    /* Update loss detection engine on ack. The function uses ack_delay only when the largest_newly_acked is also the largest acked
     * so far. So, it does not matter if the ack_delay being passed in does not apply to the largest_newly_acked. */
    quicly_loss_on_ack_received(&conn->egress.loss, largest_newly_acked.pn, state->epoch, conn->stash.now,
                                largest_newly_acked.sent_at, frame.ack_delay, includes_ack_eliciting);

    /* OnPacketAcked and OnPacketAckedCC */
    if (bytes_acked > 0) {
        conn->egress.cc.type->cc_on_acked(&conn->egress.cc, &conn->egress.loss, (uint32_t)bytes_acked, frame.largest_acknowledged,
                                          (uint32_t)(conn->egress.loss.sentmap.bytes_in_flight + bytes_acked), conn->stash.now,
                                          conn->egress.max_udp_payload_size);
        QUICLY_PROBE(QUICTRACE_CC_ACK, conn, conn->stash.now, &conn->egress.loss.rtt, conn->egress.cc.cwnd,
                     conn->egress.loss.sentmap.bytes_in_flight);
    }

    QUICLY_PROBE(CC_ACK_RECEIVED, conn, conn->stash.now, frame.largest_acknowledged, bytes_acked, conn->egress.cc.cwnd,
                 conn->egress.loss.sentmap.bytes_in_flight);

    /* loss-detection  */
    if ((ret = quicly_loss_detect_loss(&conn->egress.loss, conn->stash.now, conn->super.remote.transport_params.max_ack_delay,
                                       conn->initial == NULL && conn->handshake == NULL, on_loss_detected)) != 0)
        return ret;
    update_loss_alarm(conn, 0);

    return 0;
}